

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

void Super_WriteLibraryTreeFile_rec
               (FILE *pFile,Super_Man_t *pMan,Super_Gate_t_conflict *pSuper,int *pCounter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  
  if ((*(uint *)&pSuper->field_0x8 & 0xffffff01) != 0) {
    return;
  }
  uVar3 = Mio_GateReadPinNum(pSuper->pRoot);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      Super_WriteLibraryTreeFile_rec(pFile,pMan,pSuper->pFanins[uVar4],pCounter);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  iVar1 = *pCounter;
  *pCounter = iVar1 + 1;
  uVar2 = *(uint *)&pSuper->field_0x8;
  *(uint *)&pSuper->field_0x8 = iVar1 << 8 | uVar2 & 0xff;
  pcVar5 = "* ";
  if ((uVar2 & 2) == 0) {
    pcVar5 = "";
  }
  fputs(pcVar5,(FILE *)pFile);
  pcVar5 = Mio_GateReadName(pSuper->pRoot);
  fputs(pcVar5,(FILE *)pFile);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      fprintf((FILE *)pFile," %d",(ulong)(*(uint *)&pSuper->pFanins[uVar4]->field_0x8 >> 8));
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Super_WriteLibraryTreeFile_rec( FILE * pFile, Super_Man_t * pMan, Super_Gate_t * pSuper, int * pCounter )
{
    int nFanins, i;
    // skip an elementary variable and a gate that was already written
    if ( pSuper->fVar || pSuper->Number > 0 )
        return;
    // write the fanins
    nFanins = Mio_GateReadPinNum(pSuper->pRoot);
    for ( i = 0; i < nFanins; i++ )
        Super_WriteLibraryTreeFile_rec( pFile, pMan, pSuper->pFanins[i], pCounter );
    // finally write the gate
    pSuper->Number = (*pCounter)++;
    fprintf( pFile, "%s", pSuper->fSuper? "* " : "" );
    fprintf( pFile, "%s", Mio_GateReadName(pSuper->pRoot) );
    for ( i = 0; i < nFanins; i++ )
        fprintf( pFile, " %d", pSuper->pFanins[i]->Number );
    // write the formula 
    // this step is optional, the resulting library will work in any case
    // however, it may be helpful to for debugging to compare the same library 
    // written in the old format and written in the new format with formulas
//    fprintf( pFile, "    # %s", Super_WriteLibraryGateName( pSuper ) );
    fprintf( pFile, "\n" );
}